

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVectorTests.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_d691dd::SmallVectorReferenceInvalidationTest<slang::SmallVector<int,_3UL>_>::
SmallVectorReferenceInvalidationTest
          (SmallVectorReferenceInvalidationTest<slang::SmallVector<int,_3UL>_> *this)

{
  undefined8 in_RAX;
  int iVar1;
  undefined8 uStack_28;
  
  (anonymous_namespace)::Constructable::numConstructorCalls = 0;
  (anonymous_namespace)::Constructable::numMoveConstructorCalls = 0;
  (anonymous_namespace)::Constructable::numCopyConstructorCalls = 0;
  (anonymous_namespace)::Constructable::numDestructorCalls = 0;
  (anonymous_namespace)::Constructable::numAssignmentCalls = 0;
  (anonymous_namespace)::Constructable::numMoveAssignmentCalls = 0;
  (anonymous_namespace)::Constructable::numCopyAssignmentCalls = 0;
  (this->v).super_SmallVectorBase<int>.data_ =
       (pointer)(this->v).super_SmallVectorBase<int>.firstElement;
  (this->v).super_SmallVectorBase<int>.len = 0;
  (this->v).super_SmallVectorBase<int>.cap = 3;
  iVar1 = 1;
  uStack_28 = in_RAX;
  do {
    uStack_28 = CONCAT44(iVar1,(undefined4)uStack_28);
    slang::SmallVectorBase<int>::emplace_back<int>
              ((SmallVectorBase<int> *)this,(int *)((long)&uStack_28 + 4));
    iVar1 = iVar1 + 1;
  } while (iVar1 != 4);
  return;
}

Assistant:

SmallVectorReferenceInvalidationTest() {
        // Fill up the small size so that insertions move the elements.
        for (int it = 0, e = numBuiltinElts(v); it != e; ++it)
            v.emplace_back(it + 1);
    }